

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

string * __thiscall fmt::v5::to_string<void*>(string *__return_storage_ptr__,v5 *this,void **value)

{
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> local_48;
  basic_buffer<char> local_38;
  string *local_18;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_48.out_.container = &local_38;
  local_38.size_ = 0;
  local_38.capacity_ = 0;
  local_38._vptr_basic_buffer = (_func_int **)&PTR_grow_00264cb0;
  local_48.locale_.locale_ = (void *)0x0;
  local_18 = __return_storage_ptr__;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::write<void>
            (&local_48,*(void **)this);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const T &value) {
  std::string str;
  internal::container_buffer<std::string> buf(str);
  writer(buf).write(value);
  return str;
}